

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

void __thiscall
capnp::JsonCodec::AnnotatedEnumHandler::AnnotatedEnumHandler
          (AnnotatedEnumHandler *this,EnumSchema schema)

{
  StringPtr *pSVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  WirePointer *pWVar4;
  StructPointerCount SVar5;
  AnnotatedEnumHandler *pAVar6;
  EnumSchema EVar7;
  ElementCount EVar8;
  ArrayPtr<const_char> *pAVar9;
  ElementCount index;
  SegmentReader *pSVar10;
  uint uVar11;
  ulong uVar12;
  ArrayPtr<const_char> AVar13;
  ArrayBuilder<kj::StringPtr> builder;
  Reader anno;
  Enumerant e;
  EnumerantList enumerants;
  ArrayPtr<const_char> *pAStack_1a0;
  PointerReader local_178;
  StructReader local_158;
  RawBrandedSchema *local_128;
  size_t local_120;
  StructReader local_118;
  AnnotatedEnumHandler *local_e8;
  CapTableReader *local_e0;
  ulong local_d8;
  ArrayPtr<const_char> local_d0;
  WirePointer *local_c0;
  ElementCount local_b8;
  StructReader local_a0;
  Schema local_70;
  EnumerantList local_68;
  
  (this->super_Handler<capnp::DynamicEnum,_(capnp::Style)0>).super_HandlerBase._vptr_HandlerBase =
       (_func_int **)&PTR_encodeBase_002cd708;
  (this->schema).super_Schema.raw = (RawBrandedSchema *)schema.super_Schema.raw;
  (this->nameToValue).table.indexes.erasedCount = 0;
  (this->nameToValue).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (this->nameToValue).table.indexes.buckets.size_ = 0;
  (this->nameToValue).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  (this->valueToName).ptr = (StringPtr *)0x0;
  (this->valueToName).size_ = 0;
  (this->valueToName).disposer = (ArrayDisposer *)0x0;
  (this->nameToValue).table.rows.builder.ptr = (Entry *)0x0;
  (this->nameToValue).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry> *)0x0;
  (this->nameToValue).table.rows.builder.endPtr = (Entry *)0x0;
  local_e8 = this;
  local_70 = schema.super_Schema.raw;
  EnumSchema::getEnumerants(&local_68,(EnumSchema *)&local_70);
  pAVar9 = (ArrayPtr<const_char> *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x10,0,(ulong)local_68.list.reader.elementCount,(_func_void_void_ptr *)0x0,
                      (_func_void_void_ptr *)0x0);
  pAStack_1a0 = pAVar9;
  if (local_68.list.reader.elementCount != 0) {
    uVar12 = 0;
    do {
      EVar7.super_Schema.raw = (Schema)(Schema)local_68.parent;
      capnp::_::ListReader::getStructElement(&local_118,&local_68.list.reader,(ElementCount)uVar12);
      EVar8 = local_118.nestingLimit;
      SVar5 = local_118.pointerCount;
      pWVar4 = local_118.pointers;
      pSVar10 = local_118.segment;
      local_128 = (RawBrandedSchema *)EVar7.super_Schema.raw;
      local_120 = CONCAT62(local_120._2_6_,(short)uVar12);
      local_e0 = local_118.capTable;
      local_d0.size_ = (size_t)local_118.capTable;
      local_c0 = local_118.pointers;
      local_d0.ptr = (char *)local_118.segment;
      local_b8 = local_118.nestingLimit;
      if (local_118.pointerCount == 0) {
        local_d0.size_ = (size_t)(CapTableReader *)0x0;
        local_c0 = (WirePointer *)0x0;
        local_d0.ptr = (char *)(SegmentReader *)0x0;
        local_b8 = 0x7fffffff;
      }
      local_d8 = uVar12;
      AVar13 = (ArrayPtr<const_char>)
               capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)&local_d0,(void *)0x0,0);
      if (SVar5 < 2) {
        EVar8 = 0x7fffffff;
        local_158.capTable = (CapTableReader *)0x0;
        local_158.data = (WirePointer *)0x0;
        pSVar10 = (SegmentReader *)0x0;
      }
      else {
        local_158.data = pWVar4 + 1;
        local_158.capTable = local_e0;
      }
      local_158.segment = pSVar10;
      local_158.pointers._0_4_ = EVar8;
      capnp::_::PointerReader::getList
                ((ListReader *)&local_d0,(PointerReader *)&local_158,INLINE_COMPOSITE,(word *)0x0);
      EVar8 = local_b8;
      if (local_b8 != 0) {
        index = 0;
        do {
          capnp::_::ListReader::getStructElement(&local_158,(ListReader *)&local_d0,index);
          if ((0x3f < local_158.dataSize) && (*local_158.data == (WirePointer)0xfa5b1fd61c2e7c3d)) {
            if (local_158.pointerCount == 0) {
              local_178.nestingLimit = 0x7fffffff;
              local_178.capTable = (CapTableReader *)0x0;
              local_178.pointer = (WirePointer *)0x0;
              local_178.segment = (SegmentReader *)0x0;
            }
            else {
              local_178.pointer =
                   (WirePointer *)
                   CONCAT44(local_158.pointers._4_4_,(ElementCount)local_158.pointers);
              local_178.capTable = local_158.capTable;
              local_178.segment = local_158.segment;
              local_178.nestingLimit = local_158.nestingLimit;
            }
            capnp::_::PointerReader::getStruct(&local_a0,&local_178,(word *)0x0);
            local_178.capTable = local_a0.capTable;
            local_178.pointer = local_a0.pointers;
            local_178.segment = local_a0.segment;
            local_178.nestingLimit = local_a0.nestingLimit;
            if (local_a0.pointerCount == 0) {
              local_178.capTable = (CapTableReader *)0x0;
              local_178.pointer = (WirePointer *)0x0;
              local_178.segment = (SegmentReader *)0x0;
              local_178.nestingLimit = 0x7fffffff;
            }
            AVar13 = (ArrayPtr<const_char>)
                     capnp::_::PointerReader::getBlob<capnp::Text>(&local_178,(void *)0x0,0);
          }
          index = index + 1;
        } while (EVar8 != index);
      }
      *pAStack_1a0 = AVar13;
      pAStack_1a0 = pAStack_1a0 + 1;
      local_c0 = (WirePointer *)CONCAT62(local_c0._2_6_,(undefined2)local_120);
      local_d0 = AVar13;
      kj::
      Table<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_unsigned_short>::Callbacks>_>
      ::insert(&(this->nameToValue).table,(Entry *)&local_d0);
      uVar11 = (int)local_d8 + 1;
      uVar12 = (ulong)uVar11;
    } while (uVar11 != local_68.list.reader.elementCount);
  }
  pAVar6 = local_e8;
  local_120 = (long)pAStack_1a0 - (long)pAVar9 >> 4;
  local_118.segment = (SegmentReader *)&kj::_::HeapArrayDisposer::instance;
  pSVar1 = (this->valueToName).ptr;
  local_128 = (RawBrandedSchema *)pAVar9;
  if (pSVar1 != (StringPtr *)0x0) {
    sVar2 = (local_e8->valueToName).size_;
    (this->valueToName).ptr = (StringPtr *)0x0;
    (this->valueToName).size_ = 0;
    pAVar3 = (local_e8->valueToName).disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pSVar1,0x10,sVar2,sVar2,0);
  }
  (pAVar6->valueToName).ptr = (StringPtr *)local_128;
  (pAVar6->valueToName).size_ = local_120;
  (pAVar6->valueToName).disposer = (ArrayDisposer *)local_118.segment;
  return;
}

Assistant:

AnnotatedEnumHandler(EnumSchema schema): schema(schema) {
    auto enumerants = schema.getEnumerants();
    auto builder = kj::heapArrayBuilder<kj::StringPtr>(enumerants.size());

    for (auto e: enumerants) {
      auto proto = e.getProto();
      kj::StringPtr name = proto.getName();

      for (auto anno: proto.getAnnotations()) {
        switch (anno.getId()) {
          case JSON_NAME_ANNOTATION_ID:
            name = anno.getValue().getText();
            break;
        }
      }

      builder.add(name);
      nameToValue.insert(name, e.getIndex());
    }

    valueToName = builder.finish();
  }